

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<unsigned_short_const&>(String *__return_storage_ptr__,kj *this,unsigned_short *params)

{
  unsigned_short *value;
  CappedArray<char,_8UL> local_28;
  kj *local_18;
  unsigned_short *params_local;
  
  local_18 = this;
  params_local = (unsigned_short *)__return_storage_ptr__;
  value = fwd<unsigned_short_const&>((unsigned_short *)this);
  local_28 = toCharSequence<unsigned_short_const&>(value);
  _::concat<kj::CappedArray<char,8ul>>
            (__return_storage_ptr__,(_ *)&local_28,(CappedArray<char,_8UL> *)local_28.content);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}